

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

ER __thiscall slang::ast::Statement::eval(Statement *this,EvalContext *context)

{
  ER EVar1;
  
  EVar1 = (*(code *)(&DAT_0047fc68 + *(int *)(&DAT_0047fc68 + (ulong)this->kind * 4)))
                    (this,context,&DAT_0047fc68 + *(int *)(&DAT_0047fc68 + (ulong)this->kind * 4));
  return EVar1;
}

Assistant:

ER Statement::eval(EvalContext& context) const {
    EvalVisitor visitor;
    return visit(visitor, context);
}